

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineStencilTests.cpp
# Opt level: O1

TestCaseGroup * vkt::pipeline::createStencilTests(TestContext *testCtx)

{
  VkStencilOp *pVVar1;
  VkFormat value;
  TestNode *pTVar2;
  char *pcVar3;
  long *plVar4;
  ostream *poVar5;
  TestNode *pTVar6;
  size_type *psVar7;
  VkStencilOpState *pVVar8;
  float *pfVar9;
  int quadNdx;
  long lVar10;
  VkStencilOpState prevStencilState;
  StencilOpStateUniqueRandomIterator stencilOpItr;
  VkStencilOpState stencilState;
  VkStencilOpState firstStencilState;
  string fullName;
  string local_280;
  TestNode *local_260;
  TestContext *local_258;
  VkFormat local_24c;
  TestNode *local_248;
  TestNode *local_240;
  string local_238;
  UniqueRandomIterator<vk::VkStencilOpState> local_218;
  long local_1f0;
  VkStencilOp local_1e4;
  undefined4 uStack_1e0;
  undefined4 uStack_1dc;
  undefined4 uStack_1d8;
  undefined4 uStack_1d4;
  undefined4 uStack_1d0;
  undefined4 uStack_1cc;
  VkStencilOp local_1c8;
  undefined4 uStack_1c4;
  undefined4 uStack_1c0;
  undefined4 uStack_1bc;
  undefined4 uStack_1b8;
  undefined4 uStack_1b4;
  undefined4 uStack_1b0;
  string local_1a8 [3];
  ios_base local_138 [264];
  
  local_248 = (TestNode *)operator_new(0x70);
  local_258 = testCtx;
  tcu::TestCaseGroup::TestCaseGroup((TestCaseGroup *)local_248,testCtx,"stencil","Stencil tests");
  local_260 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)local_260,local_258,"format","Uses different stencil formats");
  UniqueRandomIterator<vk::VkStencilOpState>::UniqueRandomIterator(&local_218,0x1000,0x1000,0x7b);
  local_218._vptr_UniqueRandomIterator = (_func_int **)&PTR__UniqueRandomIterator_00d23650;
  lVar10 = 0;
  do {
    value = FragmentOperations::anon_unknown_1::EarlyFragmentTestInstance::iterate::stencilFormats
            [lVar10];
    local_1f0 = lVar10;
    pTVar2 = (TestNode *)operator_new(0x70);
    pcVar3 = ::vk::getFormatName(value);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_1a8,pcVar3,(allocator<char> *)&local_280);
    std::__cxx11::string::substr((ulong)&local_280,(ulong)local_1a8);
    de::toLower(&local_238,&local_280);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_280._M_dataplus._M_p != &local_280.field_2) {
      operator_delete(local_280._M_dataplus._M_p,local_280.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8[0]._M_dataplus._M_p != &local_1a8[0].field_2) {
      operator_delete(local_1a8[0]._M_dataplus._M_p,local_1a8[0].field_2._M_allocated_capacity + 1);
    }
    pcVar3 = (char *)CONCAT44(local_238._M_dataplus._M_p._4_4_,
                              (VkStencilOp)local_238._M_dataplus._M_p);
    local_280._M_dataplus._M_p = (pointer)&local_280.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_280,"Uses format ","");
    ::vk::getFormatName(value);
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_280);
    local_1a8[0]._M_dataplus._M_p = (pointer)&local_1a8[0].field_2;
    psVar7 = (size_type *)(plVar4 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar4 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar7) {
      local_1a8[0].field_2._0_8_ = *psVar7;
      local_1a8[0].field_2._8_8_ = plVar4[3];
    }
    else {
      local_1a8[0].field_2._0_8_ = *psVar7;
      local_1a8[0]._M_dataplus._M_p = (pointer)*plVar4;
    }
    local_1a8[0]._M_string_length = plVar4[1];
    *plVar4 = (long)psVar7;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    tcu::TestCaseGroup::TestCaseGroup
              ((TestCaseGroup *)pTVar2,local_258,pcVar3,local_1a8[0]._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8[0]._M_dataplus._M_p != &local_1a8[0].field_2) {
      operator_delete(local_1a8[0]._M_dataplus._M_p,local_1a8[0].field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_280._M_dataplus._M_p != &local_280.field_2) {
      operator_delete(local_280._M_dataplus._M_p,local_280.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_238._M_dataplus._M_p._4_4_,(VkStencilOp)local_238._M_dataplus._M_p) !=
        &local_238.field_2) {
      operator_delete((undefined1 *)
                      CONCAT44(local_238._M_dataplus._M_p._4_4_,
                               (VkStencilOp)local_238._M_dataplus._M_p),
                      CONCAT44(local_238.field_2._M_allocated_capacity._4_4_,
                               local_238.field_2._M_allocated_capacity._0_4_) + 1);
    }
    local_240 = pTVar2;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    local_24c = value;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,
               "Draws 4 quads with the following depths and dynamic stencil states: ",0x44);
    pfVar9 = (float *)&(anonymous_namespace)::StencilTest::s_quadDepths;
    lVar10 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"(",1);
      poVar5 = (ostream *)std::ostream::operator<<(local_1a8,(int)lVar10);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,") ",2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"z = ",4);
      poVar5 = std::ostream::_M_insert<double>((double)*pfVar9);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,", ",2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"frontReadMask = ",0x10);
      poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,", ",2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"frontWriteMask = ",0x11);
      poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,", ",2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"frontRef = ",0xb);
      poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,", ",2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"backReadMask = ",0xf);
      poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,", ",2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"backWriteMask = ",0x10);
      poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,", ",2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"backRef = ",10);
      std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
      lVar10 = lVar10 + 1;
      pfVar9 = pfVar9 + 1;
    } while (lVar10 != 4);
    pTVar2 = (TestNode *)operator_new(0x70);
    std::__cxx11::stringbuf::str();
    tcu::TestCaseGroup::TestCaseGroup
              ((TestCaseGroup *)pTVar2,local_258,"states",local_280._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_280._M_dataplus._M_p != &local_280.field_2) {
      operator_delete(local_280._M_dataplus._M_p,local_280.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
    local_218.m_currentIndex = 1;
    (*local_218._vptr_UniqueRandomIterator[2])
              (&local_238,&local_218,
               (ulong)*local_218.m_indices.
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                       super__Vector_impl_data._M_start);
    uStack_1b8 = local_238.field_2._M_allocated_capacity._0_4_;
    uStack_1b4 = local_238.field_2._M_allocated_capacity._4_4_;
    uStack_1b0 = local_238.field_2._8_4_;
    local_1c8 = (VkStencilOp)local_238._M_dataplus._M_p;
    uStack_1c4 = local_238._M_dataplus._M_p._4_4_;
    uStack_1c0 = (undefined4)local_238._M_string_length;
    uStack_1bc = local_238._M_string_length._4_4_;
    while( true ) {
      if ((ulong)((long)local_218.m_indices.
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)local_218.m_indices.
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_start >> 2) <= local_218.m_currentIndex) break;
      pVVar1 = local_218.m_indices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_start + local_218.m_currentIndex;
      pVVar8 = (VkStencilOpState *)
               local_218.m_indices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_start;
      local_218.m_currentIndex = local_218.m_currentIndex + 1;
      (*local_218._vptr_UniqueRandomIterator[2])(&local_1e4,&local_218,(ulong)*pVVar1);
      pTVar6 = (TestNode *)operator_new(0xb0);
      (anonymous_namespace)::getStencilStateSetName_abi_cxx11_
                (local_1a8,(_anonymous_namespace_ *)&local_1e4,(VkStencilOpState *)&local_238,pVVar8
                );
      (anonymous_namespace)::getStencilStateSetDescription_abi_cxx11_
                (&local_280,(_anonymous_namespace_ *)&local_1e4,(VkStencilOpState *)&local_238,
                 pVVar8);
      tcu::TestCase::TestCase
                ((TestCase *)pTVar6,local_258,local_1a8[0]._M_dataplus._M_p,
                 local_280._M_dataplus._M_p);
      pTVar6->_vptr_TestNode = (_func_int **)&PTR__TestCase_00d23690;
      *(VkFormat *)&pTVar6[1]._vptr_TestNode = local_24c;
      *(ulong *)((long)&pTVar6[1]._vptr_TestNode + 4) = CONCAT44(uStack_1e0,local_1e4);
      *(ulong *)((long)&pTVar6[1].m_testCtx + 4) = CONCAT44(uStack_1d8,uStack_1dc);
      pTVar6[1].m_name._M_dataplus._M_p = (pointer)CONCAT44(uStack_1d4,uStack_1d8);
      pTVar6[1].m_name._M_string_length = CONCAT44(uStack_1cc,uStack_1d0);
      pTVar6[1].m_name.field_2._M_allocated_capacity =
           CONCAT44(local_238._M_dataplus._M_p._4_4_,(VkStencilOp)local_238._M_dataplus._M_p);
      *(ulong *)((long)&pTVar6[1].m_name.field_2 + 8) =
           CONCAT44(local_238._M_string_length._4_4_,(undefined4)local_238._M_string_length);
      *(ulong *)((long)&pTVar6[1].m_name.field_2 + 0xc) =
           CONCAT44(local_238.field_2._M_allocated_capacity._0_4_,local_238._M_string_length._4_4_);
      *(ulong *)((long)&pTVar6[1].m_description._M_dataplus._M_p + 4) =
           CONCAT44(local_238.field_2._8_4_,local_238.field_2._M_allocated_capacity._4_4_);
      tcu::TestNode::addChild(pTVar2,pTVar6);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_280._M_dataplus._M_p != &local_280.field_2) {
        operator_delete(local_280._M_dataplus._M_p,local_280.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a8[0]._M_dataplus._M_p != &local_1a8[0].field_2) {
        operator_delete(local_1a8[0]._M_dataplus._M_p,local_1a8[0].field_2._M_allocated_capacity + 1
                       );
      }
      local_238._M_dataplus._M_p._0_4_ = local_1e4;
      local_238._M_dataplus._M_p._4_4_ = uStack_1e0;
      local_238._M_string_length._0_4_ = uStack_1dc;
      local_238._M_string_length._4_4_ = uStack_1d8;
      local_238.field_2._M_allocated_capacity._0_4_ = uStack_1d4;
      local_238.field_2._M_allocated_capacity._4_4_ = uStack_1d0;
      local_238.field_2._8_4_ = uStack_1cc;
    }
    pVVar8 = (VkStencilOpState *)
             local_218.m_indices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
             _M_impl.super__Vector_impl_data._M_start;
    pTVar6 = (TestNode *)operator_new(0xb0);
    (anonymous_namespace)::getStencilStateSetName_abi_cxx11_
              (local_1a8,(_anonymous_namespace_ *)&local_1c8,(VkStencilOpState *)&local_238,pVVar8);
    (anonymous_namespace)::getStencilStateSetDescription_abi_cxx11_
              (&local_280,(_anonymous_namespace_ *)&local_1c8,(VkStencilOpState *)&local_238,pVVar8)
    ;
    tcu::TestCase::TestCase
              ((TestCase *)pTVar6,local_258,local_1a8[0]._M_dataplus._M_p,local_280._M_dataplus._M_p
              );
    pTVar6->_vptr_TestNode = (_func_int **)&PTR__TestCase_00d23690;
    *(VkFormat *)&pTVar6[1]._vptr_TestNode = local_24c;
    *(ulong *)((long)&pTVar6[1]._vptr_TestNode + 4) = CONCAT44(uStack_1c4,local_1c8);
    *(ulong *)((long)&pTVar6[1].m_testCtx + 4) = CONCAT44(uStack_1bc,uStack_1c0);
    pTVar6[1].m_name._M_dataplus._M_p = (pointer)CONCAT44(uStack_1b8,uStack_1bc);
    pTVar6[1].m_name._M_string_length = CONCAT44(uStack_1b0,uStack_1b4);
    pTVar6[1].m_name.field_2._M_allocated_capacity =
         CONCAT44(local_238._M_dataplus._M_p._4_4_,(VkStencilOp)local_238._M_dataplus._M_p);
    *(ulong *)((long)&pTVar6[1].m_name.field_2 + 8) =
         CONCAT44(local_238._M_string_length._4_4_,(undefined4)local_238._M_string_length);
    *(ulong *)((long)&pTVar6[1].m_name.field_2 + 0xc) =
         CONCAT44(local_238.field_2._M_allocated_capacity._0_4_,local_238._M_string_length._4_4_);
    *(ulong *)((long)&pTVar6[1].m_description._M_dataplus._M_p + 4) =
         CONCAT44(local_238.field_2._8_4_,local_238.field_2._M_allocated_capacity._4_4_);
    tcu::TestNode::addChild(pTVar2,pTVar6);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_280._M_dataplus._M_p != &local_280.field_2) {
      operator_delete(local_280._M_dataplus._M_p,local_280.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8[0]._M_dataplus._M_p != &local_1a8[0].field_2) {
      operator_delete(local_1a8[0]._M_dataplus._M_p,local_1a8[0].field_2._M_allocated_capacity + 1);
    }
    tcu::TestNode::addChild(local_240,pTVar2);
    pTVar2 = local_240;
    local_240 = (TestNode *)0x0;
    tcu::TestNode::addChild(local_260,pTVar2);
    lVar10 = local_1f0 + 1;
  } while (lVar10 != 4);
  tcu::TestNode::addChild(local_248,local_260);
  local_218._vptr_UniqueRandomIterator = (_func_int **)&PTR__UniqueRandomIterator_00d23740;
  if ((VkStencilOpState *)
      local_218.m_indices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (VkStencilOpState *)0x0) {
    operator_delete(local_218.m_indices.
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_218.m_indices.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_218.m_indices.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return (TestCaseGroup *)local_248;
}

Assistant:

tcu::TestCaseGroup* createStencilTests (tcu::TestContext& testCtx)
{
	const VkFormat stencilFormats[] =
	{
		VK_FORMAT_S8_UINT,
		VK_FORMAT_D16_UNORM_S8_UINT,
		VK_FORMAT_D24_UNORM_S8_UINT,
		VK_FORMAT_D32_SFLOAT_S8_UINT
	};

	de::MovePtr<tcu::TestCaseGroup>		stencilTests	(new tcu::TestCaseGroup(testCtx, "stencil", "Stencil tests"));
	de::MovePtr<tcu::TestCaseGroup>		formatTests		(new tcu::TestCaseGroup(testCtx, "format", "Uses different stencil formats"));
	StencilOpStateUniqueRandomIterator	stencilOpItr	(123);

	for (size_t formatNdx = 0; formatNdx < DE_LENGTH_OF_ARRAY(stencilFormats); formatNdx++)
	{
		const VkFormat					stencilFormat	= stencilFormats[formatNdx];
		de::MovePtr<tcu::TestCaseGroup>	formatTest		(new tcu::TestCaseGroup(testCtx,
																				getFormatCaseName(stencilFormat).c_str(),
																				(std::string("Uses format ") + getFormatName(stencilFormat)).c_str()));

		de::MovePtr<tcu::TestCaseGroup>	stencilStateTests;
		{
			std::ostringstream desc;
			desc << "Draws 4 quads with the following depths and dynamic stencil states: ";
			for (int quadNdx = 0; quadNdx < StencilTest::QUAD_COUNT; quadNdx++)
			{
				const StencilTest::StencilStateConfig& stencilConfig = StencilTest::s_stencilStateConfigs[quadNdx];

				desc << "(" << quadNdx << ") "
					 << "z = " << StencilTest::s_quadDepths[quadNdx] << ", "
					 << "frontReadMask = " << stencilConfig.frontReadMask << ", "
					 << "frontWriteMask = " << stencilConfig.frontWriteMask << ", "
					 << "frontRef = " << stencilConfig.frontRef << ", "
					 << "backReadMask = " << stencilConfig.backReadMask << ", "
					 << "backWriteMask = " << stencilConfig.backWriteMask << ", "
					 << "backRef = " << stencilConfig.backRef;
			}

			stencilStateTests = de::MovePtr<tcu::TestCaseGroup>(new tcu::TestCaseGroup(testCtx, "states", desc.str().c_str()));
		}

		stencilOpItr.reset();

		VkStencilOpState		prevStencilState	= stencilOpItr.next();
		const VkStencilOpState	firstStencilState	= prevStencilState;

		while (stencilOpItr.hasNext())
		{
			const VkStencilOpState stencilState = stencilOpItr.next();

			// Use current stencil state in front fraces and previous state in back faces
			stencilStateTests->addChild(new StencilTest(testCtx,
														getStencilStateSetName(stencilState, prevStencilState),
														getStencilStateSetDescription(stencilState, prevStencilState),
														stencilFormat,
														stencilState,
														prevStencilState));

			prevStencilState = stencilState;
		}

		// Use first stencil state with last stencil state. This would make the test suite cover all states in front and back faces.
		stencilStateTests->addChild(new StencilTest(testCtx,
													getStencilStateSetName(firstStencilState, prevStencilState),
													getStencilStateSetDescription(firstStencilState, prevStencilState),
													stencilFormat,
													firstStencilState,
													prevStencilState));

		formatTest->addChild(stencilStateTests.release());
		formatTests->addChild(formatTest.release());
	}
	stencilTests->addChild(formatTests.release());

	return stencilTests.release();
}